

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Perform
          (Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  pvVar2 = internal::
           Apply<std::function<std::vector<unsigned_char,std::allocator<unsigned_char>>const&()>const&,std::tuple<>>
                     (&this->fun_,(tuple<> *)((long)&this_local + 7));
  return pvVar2;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }